

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Resupply_Received_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Resupply_Received_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  KFLOAT32 KVar4;
  KString local_260;
  KString local_240;
  __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
  local_220;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Resupply_Received_PDU *local_18;
  Resupply_Received_PDU *this_local;
  
  local_18 = this;
  this_local = (Resupply_Received_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Resupply Received PDU-\n");
  Logistics_Header::GetAsString_abi_cxx11_((KString *)&citr,&this->super_Logistics_Header);
  UTILS::IndentString(&local_1f0,(KString *)&citr,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\tNumber Of Supply Types: ");
  std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumSupplyTypes);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
            begin(&this->m_vSupplies);
  local_220._M_current =
       (Supplies *)
       std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::end
                 (&this->m_vSupplies);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_220);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
             ::operator->(&citrEnd);
    (*(pSVar3->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[2])(&local_260);
    UTILS::IndentString(&local_240,&local_260,1,'\t');
    poVar2 = std::operator<<(local_190,(string *)&local_240);
    poVar2 = std::operator<<(poVar2,"\tQuantity :\t");
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
             ::operator->(&citrEnd);
    KVar4 = DATA_TYPE::Supplies::GetQuantity(pSVar3);
    std::ostream::operator<<(poVar2,(float)KVar4);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::Supplies_*,_std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Resupply_Received_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Resupply Received PDU-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tNumber Of Supply Types: " << ( KUINT16 )m_ui8NumSupplyTypes;

    // Now add supplies
    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 )
           << "\tQuantity :	" << citr->GetQuantity();
    }

    return ss.str();
}